

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  format_args args;
  back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>
  *in_RSI;
  int in_EDI;
  basic_string_view<char> bVar1;
  int ignore;
  string_view sv;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_ffffffffffffff08;
  buffer<char> *in_stack_ffffffffffffff10;
  basic_string_view<char> *pbVar2;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff20;
  basic_string_view<char> local_d8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *local_c8;
  char local_ba;
  char local_b9;
  undefined4 in_stack_ffffffffffffff50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  undefined8 uVar3;
  int local_3c;
  char *local_38;
  undefined8 local_30;
  undefined1 *local_20;
  basic_string_view<char> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  if ((in_EDI < 0) || (99 < in_EDI)) {
    local_c8 = (basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)
               std::
               back_inserter<fmt::v11::basic_memory_buffer<char,250ul,fmt::v11::detail::allocator<char>>>
                         (in_stack_ffffffffffffff08);
    pad2::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffff20);
    pbVar2 = &local_d8;
    local_20 = &stack0xffffffffffffff27;
    local_18 = pbVar2;
    bVar1 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x5ee1e6);
    *pbVar2 = bVar1;
    local_38 = "{:02}";
    local_30 = 5;
    local_3c = 0;
    ::fmt::v11::detail::ignore_unused<int>(&local_3c);
    local_8 = &stack0xffffffffffffff68;
    local_10 = &stack0xffffffffffffff58;
    uVar3 = 1;
    args.desc_._4_4_ = in_EDI;
    args.desc_._0_4_ = in_stack_ffffffffffffff50;
    args.field_1.args_ = in_stack_ffffffffffffff58.args_;
    ::fmt::v11::
    vformat_to<std::back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>_&,_0>
              (in_RSI,in_stack_ffffffffffffff60,args);
  }
  else {
    local_b9 = (char)(in_EDI / 10) + '0';
    ::fmt::v11::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    local_ba = (char)(in_EDI % 10) + '0';
    ::fmt::v11::detail::buffer<char>::push_back
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest) {
    if (n >= 0 && n < 100)  // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    } else  // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), SPDLOG_FMT_STRING("{:02}"), n);
    }
}